

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O0

void cgltf_write_extensions(cgltf_write_context *context,uint32_t extension_flags)

{
  uint32_t extension_flags_local;
  cgltf_write_context *context_local;
  
  if ((extension_flags & 1) != 0) {
    cgltf_write_stritem(context,"KHR_texture_transform");
  }
  if ((extension_flags & 2) != 0) {
    cgltf_write_stritem(context,"KHR_materials_unlit");
  }
  if ((extension_flags & 4) != 0) {
    cgltf_write_stritem(context,"KHR_materials_pbrSpecularGlossiness");
  }
  if ((extension_flags & 8) != 0) {
    cgltf_write_stritem(context,"KHR_lights_punctual");
  }
  if ((extension_flags & 0x10) != 0) {
    cgltf_write_stritem(context,"KHR_draco_mesh_compression");
  }
  if ((extension_flags & 0x20) != 0) {
    cgltf_write_stritem(context,"KHR_materials_clearcoat");
  }
  if ((extension_flags & 0x40) != 0) {
    cgltf_write_stritem(context,"KHR_materials_ior");
  }
  if ((extension_flags & 0x80) != 0) {
    cgltf_write_stritem(context,"KHR_materials_specular");
  }
  if ((extension_flags & 0x100) != 0) {
    cgltf_write_stritem(context,"KHR_materials_transmission");
  }
  if ((extension_flags & 0x200) != 0) {
    cgltf_write_stritem(context,"KHR_materials_sheen");
  }
  return;
}

Assistant:

static void cgltf_write_extensions(cgltf_write_context* context, uint32_t extension_flags)
{
	if (extension_flags & CGLTF_EXTENSION_FLAG_TEXTURE_TRANSFORM) {
		cgltf_write_stritem(context, "KHR_texture_transform");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_MATERIALS_UNLIT) {
		cgltf_write_stritem(context, "KHR_materials_unlit");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_SPECULAR_GLOSSINESS) {
		cgltf_write_stritem(context, "KHR_materials_pbrSpecularGlossiness");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_LIGHTS_PUNCTUAL) {
		cgltf_write_stritem(context, "KHR_lights_punctual");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_DRACO_MESH_COMPRESSION) {
		cgltf_write_stritem(context, "KHR_draco_mesh_compression");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_MATERIALS_CLEARCOAT) {
		cgltf_write_stritem(context, "KHR_materials_clearcoat");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_MATERIALS_IOR) {
		cgltf_write_stritem(context, "KHR_materials_ior");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_MATERIALS_SPECULAR) {
		cgltf_write_stritem(context, "KHR_materials_specular");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_MATERIALS_TRANSMISSION) {
		cgltf_write_stritem(context, "KHR_materials_transmission");
	}
	if (extension_flags & CGLTF_EXTENSION_FLAG_MATERIALS_SHEEN) {
		cgltf_write_stritem(context, "KHR_materials_sheen");
	}
}